

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_VersionSkewPast_Test::
~CommandLineInterfaceTest_Plugin_VersionSkewPast_Test
          (CommandLineInterfaceTest_Plugin_VersionSkewPast_Test *this)

{
  CommandLineInterfaceTest_Plugin_VersionSkewPast_Test *this_local;
  
  ~CommandLineInterfaceTest_Plugin_VersionSkewPast_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_VersionSkewPast) {
  CreateTempFile("foo.proto", R"schema(
    edition = "1_TEST_ONLY";
    message Foo {
      int32 i = 1;
    }
  )schema");

  SetMockGeneratorTestCase("low_minimum");
  Run("protocol_compiler "
      "--proto_path=$tmpdir foo.proto --plug_out=$tmpdir");

  ExpectErrorSubstring(
      "foo.proto:2:5: Edition 1_TEST_ONLY is earlier than the minimum "
      "supported edition PROTO2");
}